

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SwapUVRow_C(uint8_t *src_uv,uint8_t *dst_vu,int width)

{
  uint8_t uVar1;
  uint8_t v;
  uint8_t u;
  int x;
  int width_local;
  uint8_t *dst_vu_local;
  uint8_t *src_uv_local;
  
  dst_vu_local = dst_vu;
  src_uv_local = src_uv;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = *src_uv_local;
    *dst_vu_local = src_uv_local[1];
    dst_vu_local[1] = uVar1;
    src_uv_local = src_uv_local + 2;
    dst_vu_local = dst_vu_local + 2;
  }
  return;
}

Assistant:

void SwapUVRow_C(const uint8_t* src_uv, uint8_t* dst_vu, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t u = src_uv[0];
    uint8_t v = src_uv[1];
    dst_vu[0] = v;
    dst_vu[1] = u;
    src_uv += 2;
    dst_vu += 2;
  }
}